

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall ui::Box::show(Box *this)

{
  uint uVar1;
  Renderable *pRVar2;
  ulong local_18;
  size_t i;
  Box *this_local;
  
  Renderable::show(&this->super_Renderable);
  local_18 = 0;
  while( true ) {
    uVar1 = Container::count(&this->super_Container);
    if (uVar1 <= local_18) break;
    pRVar2 = Container::operator[](&this->super_Container,(uint)local_18);
    (*(pRVar2->super_Area)._vptr_Area[0xc])();
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void Box::show() {
    Renderable::show();
    for(size_t i = 0; i < count(); ++i) {
        operator[](i)->show();
    }
}